

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

void __thiscall phosg::io_error::io_error(io_error *this,int fd,string *what)

{
  string local_38;
  
  string_printf_abi_cxx11_(&local_38,"io error on fd %d: %s",fd,(what->_M_dataplus)._M_p);
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this->_vptr_io_error = (_func_int **)0x124bd8;
  *(undefined8 *)&this->field_0x10 = 0x124c08;
  this->error = -1;
  return;
}

Assistant:

io_error::io_error(int fd, const string& what)
    : runtime_error(string_printf("io error on fd %d: %s", fd, what.c_str())),
      error(-1) {}